

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_string_view.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestStringViewExtension::~TestStringViewExtension(TestStringViewExtension *this)

{
  ~TestStringViewExtension(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestStringViewExtension::~TestStringViewExtension() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestStringViewExtension)
  SharedDtor(*this);
}